

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
Wasm::WasmBytecodeGenerator::EnterEvalStackScope(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  Type *pTVar1;
  Type pEVar2;
  EmitInfo EVar3;
  uint32 index;
  
  index = 0;
  JsUtil::List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(&(this->m_evalStack).list,0);
  pEVar2 = (this->m_evalStack).list.
           super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer +
           (this->m_evalStack).list.
           super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count;
  pEVar2->super_EmitInfoBase = 0xffffffff;
  pEVar2->type = Limit;
  pTVar1 = &(this->m_evalStack).list.
            super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count;
  *pTVar1 = *pTVar1 + 1;
  if ((blockInfo->paramInfo).count != 0) {
    do {
      EVar3 = PolymorphicEmitInfo::GetInfo(&blockInfo->paramInfo,index);
      JsUtil::
      List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(&(this->m_evalStack).list,0);
      (this->m_evalStack).list.
      super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer
      [(this->m_evalStack).list.
       super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count] = EVar3;
      pTVar1 = &(this->m_evalStack).list.
                super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count;
      *pTVar1 = *pTVar1 + 1;
      index = index + 1;
    } while (index < (blockInfo->paramInfo).count);
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::EnterEvalStackScope(const BlockInfo* blockInfo)
{
    m_evalStack.Push(EmitInfo(WasmTypes::Limit));
    // Push the in-params of the block upon entering the scope
    for (uint32 i = 0; i < blockInfo->paramInfo.Count(); ++i)
    {
        m_evalStack.Push(blockInfo->paramInfo.GetInfo(i));
    }
}